

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O3

Abc_Cex_t * Abc_CexMakeTriv(int nRegs,int nTruePis,int nTruePos,int iFrameOut)

{
  Abc_Cex_t *pAVar1;
  uint uVar2;
  
  if (0 < nRegs) {
    uVar2 = (iFrameOut / nTruePos + 1) * nTruePis + nRegs;
    pAVar1 = (Abc_Cex_t *)
             calloc(1,(long)(int)((((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0)) * 4 + 0x14)
    ;
    pAVar1->nRegs = nRegs;
    pAVar1->nPis = nTruePis;
    pAVar1->nBits = uVar2;
    pAVar1->iPo = iFrameOut % nTruePos;
    pAVar1->iFrame = iFrameOut / nTruePos;
    return pAVar1;
  }
  __assert_fail("nRegs > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilCex.c"
                ,0x59,"Abc_Cex_t *Abc_CexMakeTriv(int, int, int, int)");
}

Assistant:

Abc_Cex_t * Abc_CexMakeTriv( int nRegs, int nTruePis, int nTruePos, int iFrameOut )
{
    Abc_Cex_t * pCex;
    int iPo, iFrame;
    assert( nRegs > 0 );
    iPo    = iFrameOut % nTruePos;
    iFrame = iFrameOut / nTruePos;
    // allocate the counter example
    pCex = Abc_CexAlloc( nRegs, nTruePis, iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;
    return pCex;
}